

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  BoolVector wrap;
  CoordinateVector ghosts_00;
  DivisionsVector divs;
  int rank;
  ostream *poVar1;
  QueuePolicy *q_policy;
  undefined8 uVar2;
  CoordinateVector ghosts;
  pointer piStack_18a0;
  _Bit_type *in_stack_ffffffffffffe768;
  uint in_stack_ffffffffffffe770;
  undefined4 in_stack_ffffffffffffe774;
  _Bit_type *in_stack_ffffffffffffe778;
  _Bit_pointer local_1878;
  vector<bool,_std::allocator<bool>_> local_1870;
  DestroyBlock local_1848;
  CreateBlock local_1828;
  _Any_data local_1808;
  code *local_17f8;
  code *local_17f0;
  vector<bool,_std::allocator<bool>_> local_17e8;
  communicator world;
  environment env;
  vector<bool,_std::allocator<bool>_> local_17a0;
  _Any_data local_1778;
  code *local_1768;
  undefined8 uStack_1760;
  _Any_data local_1758;
  code *local_1748;
  undefined8 uStack_1740;
  void *local_1738;
  undefined8 uStack_1730;
  long local_1728;
  vector<int,_std::allocator<int>_> local_1718;
  communicator local_1700;
  ContiguousAssigner assigner;
  Bounds domain;
  code *local_1658;
  undefined8 local_1650;
  Master master;
  
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&domain,&master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  assigner.super_StaticAssigner.super_Assigner.size_ = 8;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = 0x20;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_001376a0;
  diy::Bounds<int>::Bounds(&domain,3);
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
  rank = world.rank_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rank ",5);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rank);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_1700.comm_.data = world.comm_.data;
  local_1700.rank_ = world.rank_;
  local_1700.size_ = world.size_;
  local_1700.owner_ = false;
  local_1828.super__Function_base._M_functor._8_8_ = 0;
  local_1828.super__Function_base._M_functor._M_unused._M_object = Block::create;
  local_1828._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_1828.super__Function_base._M_manager =
       std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_1848.super__Function_base._M_functor._8_8_ = 0;
  local_1848.super__Function_base._M_functor._M_unused._M_object = Block::destroy;
  local_1848._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_1848.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_1758._M_unused._M_object = (void *)0x0;
  local_1758._8_8_ = 0;
  local_1748 = (code *)0x0;
  uStack_1740 = 0;
  local_1778._M_unused._M_object = (void *)0x0;
  local_1778._8_8_ = 0;
  local_1768 = (code *)0x0;
  uStack_1760 = 0;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_00137720;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_1700,1,-1,&local_1828,&local_1848,(ExternalStorage *)0x0,
                      (SaveBlock *)&local_1758,(LoadBlock *)&local_1778,q_policy);
  if (local_1768 != (code *)0x0) {
    (*local_1768)(&local_1778,&local_1778,__destroy_functor);
  }
  if (local_1748 != (code *)0x0) {
    (*local_1748)(&local_1758,&local_1758,__destroy_functor);
  }
  if (local_1848.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1848.super__Function_base._M_manager)
              ((_Any_data *)&local_1848,(_Any_data *)&local_1848,__destroy_functor);
  }
  if (local_1828.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1828.super__Function_base._M_manager)
              ((_Any_data *)&local_1828,(_Any_data *)&local_1828,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_1700);
  local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_17e8,true);
  local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_17a0,true);
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_17a0,true);
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1808._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&ghosts,(iterator)0x0,(int *)local_1808._M_pod_data);
  local_1808._0_4_ = 2;
  if (ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&ghosts,(iterator)
                       ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_1808._M_pod_data);
  }
  else {
    *ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = 2;
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffe768,&local_17e8);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_1870,&local_17a0);
  uVar2 = 0x104f80;
  std::vector<int,_std::allocator<int>_>::vector(&local_1718,&ghosts);
  local_1738 = (void *)0x0;
  uStack_1730 = 0;
  local_1728 = 0;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = &local_1718;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&local_1870;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)&local_1738;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = uVar2;
  wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)
         ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piStack_18a0;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish._0_4_
       = in_stack_ffffffffffffe770;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)in_stack_ffffffffffffe768;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish._4_4_
       = in_stack_ffffffffffffe774;
  divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe778;
  diy::decompose<diy::Bounds<int>>
            (3,rank,&domain,&assigner.super_StaticAssigner,&master,
             (BoolVector *)&stack0xffffffffffffe768,wrap,ghosts_00,divs);
  if (local_1738 != (void *)0x0) {
    operator_delete(local_1738,local_1728 - (long)local_1738);
  }
  if (local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_1870.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (in_stack_ffffffffffffe768 != (_Bit_type *)0x0) {
    operator_delete(in_stack_ffffffffffffe768,(long)local_1878 - (long)in_stack_ffffffffffffe768);
  }
  local_1658 = Block::show_link;
  local_1650 = 0;
  local_1808._M_unused._M_object = (void *)0x0;
  local_1808._8_8_ = 0;
  local_17f0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17f8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
            (&master,(offset_in_Block_to_subr *)&local_1658,(Skip *)&local_1808);
  if (local_17f8 != (code *)0x0) {
    (*local_17f8)(&local_1808,&local_1808,__destroy_functor);
  }
  if (ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_17a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_17e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  diy::Master::~Master(&master);
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  int rank = world.rank();
  std::cout << "Rank " << rank << ":" << std::endl;
  diy::Master master(world, 1, -1, &Block::create, &Block::destroy);

  diy::RegularDecomposer<Bounds>::BoolVector          share_face;
  share_face.push_back(true);
  diy::RegularDecomposer<Bounds>::BoolVector          wrap;
  wrap.push_back(true);
  wrap.push_back(true);
  diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
  ghosts.push_back(1); ghosts.push_back(2);
  diy::decompose(3, rank, domain, assigner, master, share_face, wrap, ghosts);

  master.foreach(&Block::show_link);
}